

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

upb_DecodeStatus
upb_DecodeLengthPrefixed
          (char *buf,size_t size,upb_Message *msg,size_t *num_bytes_read,upb_MiniTable *mt,
          upb_ExtensionRegistry *extreg,int options,upb_Arena *arena)

{
  byte bVar1;
  upb_DecodeStatus uVar2;
  byte bVar3;
  ulong size_00;
  size_t sVar4;
  long lVar5;
  
  sVar4 = 10;
  if (size < 10) {
    sVar4 = size;
  }
  bVar3 = 0;
  lVar5 = 0;
  size_00 = 0;
  do {
    if (-lVar5 == sVar4) goto LAB_002471c1;
    bVar1 = *buf;
    buf = (char *)((byte *)buf + 1);
    size_00 = size_00 + ((ulong)(bVar1 & 0x7f) << (bVar3 & 0x3f));
    lVar5 = lVar5 + -1;
    bVar3 = bVar3 + 7;
  } while ((char)bVar1 < '\0');
  *num_bytes_read = size_00 - lVar5;
  if ((size_00 < 0x80000000) && (size_00 - lVar5 <= size)) {
    uVar2 = upb_Decode(buf,size_00,msg,mt,extreg,options,arena);
  }
  else {
LAB_002471c1:
    uVar2 = kUpb_DecodeStatus_Malformed;
  }
  return uVar2;
}

Assistant:

upb_DecodeStatus upb_DecodeLengthPrefixed(const char* buf, size_t size,
                                          upb_Message* msg,
                                          size_t* num_bytes_read,
                                          const upb_MiniTable* mt,
                                          const upb_ExtensionRegistry* extreg,
                                          int options, upb_Arena* arena) {
  // To avoid needing to make a Decoder just to decode the initial length,
  // hand-decode the leading varint for the message length here.
  uint64_t msg_len = 0;
  for (size_t i = 0;; ++i) {
    if (i >= size || i > 9) {
      return kUpb_DecodeStatus_Malformed;
    }
    uint64_t b = *buf;
    buf++;
    msg_len += (b & 0x7f) << (i * 7);
    if ((b & 0x80) == 0) {
      *num_bytes_read = i + 1 + msg_len;
      break;
    }
  }

  // If the total number of bytes we would read (= the bytes from the varint
  // plus however many bytes that varint says we should read) is larger then the
  // input buffer then error as malformed.
  if (*num_bytes_read > size) {
    return kUpb_DecodeStatus_Malformed;
  }
  if (msg_len > INT32_MAX) {
    return kUpb_DecodeStatus_Malformed;
  }

  return upb_Decode(buf, msg_len, msg, mt, extreg, options, arena);
}